

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int get_request_handler(mg_connection *conn,int handler_type,mg_request_handler *handler,
                       mg_websocket_subprotocols **subprotocols,
                       mg_websocket_connect_handler *connect_handler,
                       mg_websocket_ready_handler *ready_handler,
                       mg_websocket_data_handler *data_handler,
                       mg_websocket_close_handler *close_handler,
                       mg_authorization_handler *auth_handler,void **cbdata,
                       mg_handler_info **handler_info)

{
  char *__s;
  mg_context *pmVar1;
  mg_handler_info *pmVar2;
  ulong __n;
  bool bVar3;
  mg_handler_info *pmVar4;
  int iVar5;
  mg_request_info *pmVar6;
  size_t sVar7;
  ptrdiff_t pVar8;
  mg_authorization_handler p_Var9;
  mg_match_context *mcx;
  int iVar10;
  bool bVar11;
  
  if (conn == (mg_connection *)0x0) {
    pmVar6 = (mg_request_info *)0x0;
  }
  else {
    pmVar6 = (mg_request_info *)0x0;
    if (conn->connection_type == 1) {
      pmVar6 = &conn->request_info;
    }
  }
  if (pmVar6 != (mg_request_info *)0x0) {
    __s = pmVar6->local_uri;
    mcx = (mg_match_context *)subprotocols;
    sVar7 = strlen(__s);
    if (((conn == (mg_connection *)0x0) || (pmVar1 = conn->phys_ctx, pmVar1 == (mg_context *)0x0))
       || (conn->dom_ctx == (mg_domain_context *)0x0)) {
      conn = (mg_connection *)0x0;
LAB_0011af8c:
      bVar11 = false;
    }
    else {
      if (pmVar1->context_type == 1) {
        pthread_mutex_lock((pthread_mutex_t *)&pmVar1->nonce_mutex);
      }
      pmVar2 = conn->dom_ctx->handlers;
      pmVar4 = pmVar2;
      iVar10 = 0;
      do {
        for (; pmVar4 != (mg_handler_info *)0x0; pmVar4 = pmVar4->next) {
          if (pmVar4->handler_type == handler_type) {
            if (iVar10 == 1) {
              __n = pmVar4->uri_len;
              if ((__n < sVar7) && (__s[__n] == '/')) {
                iVar5 = bcmp(pmVar4->uri,__s,__n);
LAB_0011af12:
                bVar11 = iVar5 == 0;
LAB_0011af35:
                if (bVar11) {
                  if (handler_type == 0) {
                    iVar10 = 2;
                    if (pmVar4->removing != 0) break;
                    *handler = pmVar4->handler;
                    pmVar4->refcount = pmVar4->refcount + 1;
                    *handler_info = pmVar4;
                  }
                  else {
                    if (handler_type == 1) {
                      *subprotocols = pmVar4->subprotocols;
                      *connect_handler = pmVar4->connect_handler;
                      *ready_handler = pmVar4->ready_handler;
                      *data_handler = pmVar4->data_handler;
                      p_Var9 = (mg_authorization_handler)pmVar4->close_handler;
                    }
                    else {
                      p_Var9 = pmVar4->auth_handler;
                      close_handler = (mg_websocket_close_handler *)auth_handler;
                    }
                    *close_handler = (mg_websocket_close_handler)p_Var9;
                  }
                  *cbdata = pmVar4->cbdata;
                  pmVar1 = conn->phys_ctx;
                  conn = (mg_connection *)0x1;
                  if (pmVar1 == (mg_context *)0x0) goto LAB_0011af8c;
                  bVar3 = false;
                  iVar10 = pmVar1->context_type;
                  bVar11 = false;
                  goto joined_r0x0011b047;
                }
              }
            }
            else if (iVar10 == 0) {
              if (pmVar4->uri_len == sVar7) {
                iVar5 = strcmp(pmVar4->uri,__s);
                goto LAB_0011af12;
              }
            }
            else if (pmVar4->uri != (char *)0x0) {
              pVar8 = mg_match_alternatives(pmVar4->uri,pmVar4->uri_len,__s,mcx);
              bVar11 = 0 < pVar8;
              goto LAB_0011af35;
            }
          }
        }
        bVar11 = iVar10 < 2;
        pmVar4 = pmVar2;
        iVar10 = iVar10 + 1;
      } while (bVar11);
      pmVar1 = conn->phys_ctx;
      if (pmVar1 == (mg_context *)0x0) {
        bVar11 = true;
      }
      else {
        bVar3 = true;
        iVar10 = pmVar1->context_type;
        bVar11 = true;
joined_r0x0011b047:
        if (iVar10 == 1) {
          pthread_mutex_unlock((pthread_mutex_t *)&pmVar1->nonce_mutex);
          conn = (mg_connection *)0x1;
          bVar11 = bVar3;
        }
      }
    }
    if (!bVar11) {
      return (int)conn;
    }
  }
  return 0;
}

Assistant:

static int
get_request_handler(struct mg_connection *conn,
                    int handler_type,
                    mg_request_handler *handler,
                    struct mg_websocket_subprotocols **subprotocols,
                    mg_websocket_connect_handler *connect_handler,
                    mg_websocket_ready_handler *ready_handler,
                    mg_websocket_data_handler *data_handler,
                    mg_websocket_close_handler *close_handler,
                    mg_authorization_handler *auth_handler,
                    void **cbdata,
                    struct mg_handler_info **handler_info)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	if (request_info) {
		const char *uri = request_info->local_uri;
		size_t urilen = strlen(uri);
		struct mg_handler_info *tmp_rh;
		int step, matched;

		if (!conn || !conn->phys_ctx || !conn->dom_ctx) {
			return 0;
		}

		mg_lock_context(conn->phys_ctx);

		for (step = 0; step < 3; step++) {
			for (tmp_rh = conn->dom_ctx->handlers; tmp_rh != NULL;
			     tmp_rh = tmp_rh->next) {
				if (tmp_rh->handler_type != handler_type) {
					continue;
				}
				if (step == 0) {
					/* first try for an exact match */
					matched = (tmp_rh->uri_len == urilen)
					          && (strcmp(tmp_rh->uri, uri) == 0);
				} else if (step == 1) {
					/* next try for a partial match, we will accept
					uri/something */
					matched =
					    (tmp_rh->uri_len < urilen)
					    && (uri[tmp_rh->uri_len] == '/')
					    && (memcmp(tmp_rh->uri, uri, tmp_rh->uri_len) == 0);
				} else {
					/* finally try for pattern match */
					matched =
					    match_prefix(tmp_rh->uri, tmp_rh->uri_len, uri) > 0;
				}
				if (matched) {
					if (handler_type == WEBSOCKET_HANDLER) {
						*subprotocols = tmp_rh->subprotocols;
						*connect_handler = tmp_rh->connect_handler;
						*ready_handler = tmp_rh->ready_handler;
						*data_handler = tmp_rh->data_handler;
						*close_handler = tmp_rh->close_handler;
					} else if (handler_type == REQUEST_HANDLER) {
						if (tmp_rh->removing) {
							/* Treat as none found */
							step = 2;
							break;
						}
						*handler = tmp_rh->handler;
						/* Acquire handler and give it back */
						tmp_rh->refcount++;
						*handler_info = tmp_rh;
					} else { /* AUTH_HANDLER */
						*auth_handler = tmp_rh->auth_handler;
					}
					*cbdata = tmp_rh->cbdata;
					mg_unlock_context(conn->phys_ctx);
					return 1;
				}
			}
		}

		mg_unlock_context(conn->phys_ctx);
	}
	return 0; /* none found */
}